

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

ON_Brep * ON_BrepWedge(ON_3dPoint *corners,ON_Brep *pBrep)

{
  ON_CurveArray *this;
  ulong uVar1;
  long lVar2;
  undefined8 *puVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ON_BrepVertex *pOVar8;
  ON_Surface *pOVar9;
  ON_3dPoint vertex_point;
  ON_Brep *this_00;
  int si;
  ON_Brep *this_01;
  long lVar10;
  ON_LineCurve *pOVar11;
  ulong uVar12;
  ulong uVar13;
  ON_NurbsSurface *pS;
  double *pdVar14;
  ON_BrepFace *face;
  ON_BrepLoop *loop;
  ON_BrepTrim *pOVar15;
  ON_BrepVertex *pOVar16;
  long lVar17;
  int iVar18;
  ON_3dPoint *this_02;
  ON_3dPoint *this_03;
  long lVar19;
  ON_3dPoint *p;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval s;
  ON_2dPoint p0;
  ON_Interval t;
  ON_2dPoint p3;
  ON_2dPoint p2;
  ON_2dPoint p1;
  ON_3dPoint local_d0;
  ON_BrepEdge *local_b8;
  ON_BrepEdge *local_b0;
  long local_a8;
  ON_BrepEdge *local_a0;
  ON_Brep *local_98;
  ON_BrepEdge *local_90;
  ON_2dPoint local_88;
  ON_3dVector local_78;
  ON_2dPoint local_60;
  ON_2dPoint local_50;
  ON_2dPoint local_40;
  
  if (corners != (ON_3dPoint *)0x0) {
    if (pBrep == (ON_Brep *)0x0) {
      this_01 = (ON_Brep *)operator_new(0x138);
      ON_Brep::ON_Brep(this_01);
    }
    else {
      ON_Brep::Destroy(pBrep);
      this_01 = pBrep;
    }
    if ((uint)(this_01->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < 0x12) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity
                (&(this_01->m_C2).super_ON_SimpleArray<ON_Curve_*>,0x12);
    }
    this = &this_01->m_C3;
    if ((uint)(this_01->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < 9) {
      ON_SimpleArray<ON_Curve_*>::SetCapacity(&this->super_ON_SimpleArray<ON_Curve_*>,9);
    }
    if ((uint)(this_01->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < 5) {
      ON_SimpleArray<ON_Surface_*>::SetCapacity
                (&(this_01->m_S).super_ON_SimpleArray<ON_Surface_*>,5);
    }
    if ((uint)(this_01->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
              m_capacity < 6) {
      ON_ClassArray<ON_BrepVertex>::SetCapacity((ON_ClassArray<ON_BrepVertex> *)&this_01->m_V,6);
    }
    if ((uint)(this_01->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
              m_capacity < 9) {
      ON_ClassArray<ON_BrepEdge>::SetCapacity((ON_ClassArray<ON_BrepEdge> *)&this_01->m_E,9);
    }
    if ((uint)(this_01->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
              m_capacity < 5) {
      ON_ClassArray<ON_BrepLoop>::SetCapacity((ON_ClassArray<ON_BrepLoop> *)&this_01->m_L,5);
    }
    if ((uint)(this_01->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
              m_capacity < 0x12) {
      ON_ClassArray<ON_BrepTrim>::SetCapacity((ON_ClassArray<ON_BrepTrim> *)&this_01->m_T,0x12);
    }
    if ((uint)(this_01->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
              m_capacity < 5) {
      ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)&this_01->m_F,5);
    }
    lVar17 = 0;
    local_98 = pBrep;
    do {
      vertex_point.z = *(double *)((long)&corners->z + lVar17);
      vertex_point._0_16_ = *(undefined1 (*) [16])((long)&corners->x + lVar17);
      ON_Brep::NewVertex(this_01,vertex_point,0.0);
      lVar17 = lVar17 + 0x18;
    } while (lVar17 != 0x90);
    lVar19 = 0;
    lVar17 = 0;
    do {
      pOVar8 = (this_01->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      lVar2 = lVar17 + 1;
      lVar10 = 0;
      if (lVar17 != 2) {
        lVar10 = lVar2;
      }
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)((long)&(pOVar8->super_ON_Point).point.x + lVar19),
                 &pOVar8[lVar10].super_ON_Point.point);
      local_d0.x = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_d0);
      ON_Brep::NewEdge(this_01,(ON_BrepVertex *)
                               ((long)&(pOVar8->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar19),pOVar8 + lVar10,(int)lVar17,
                       (ON_Interval *)0x0,0.0);
      lVar19 = lVar19 + 0x58;
      lVar17 = lVar2;
    } while (lVar2 != 3);
    lVar17 = 0x108;
    uVar12 = 3;
    do {
      pOVar8 = (this_01->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      uVar1 = uVar12 + 1;
      uVar13 = uVar1 & 0xffffffff;
      if (lVar17 == 0x1b8) {
        uVar13 = 3;
      }
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)((long)&(pOVar8->super_ON_Point).point.x + lVar17),
                 &pOVar8[uVar13].super_ON_Point.point);
      local_d0.x = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_d0);
      ON_Brep::NewEdge(this_01,(ON_BrepVertex *)
                               ((long)&(pOVar8->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar17),pOVar8 + uVar13,(int)uVar12,
                       (ON_Interval *)0x0,0.0);
      lVar17 = lVar17 + 0x58;
      uVar12 = uVar1;
    } while (uVar1 != 6);
    iVar18 = 6;
    lVar17 = 0x10;
    do {
      pOVar8 = (this_01->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)
                         ((long)&(pOVar8->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                 _vptr_ON_Object + lVar17),
                 (ON_3dPoint *)
                 ((long)&pOVar8[3].super_ON_Point.super_ON_Geometry.super_ON_Object._vptr_ON_Object
                 + lVar17));
      local_d0.x = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append
                (&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&local_d0);
      ON_Brep::NewEdge(this_01,(ON_BrepVertex *)((long)pOVar8 + lVar17 + -0x10),
                       (ON_BrepVertex *)((long)&pOVar8[2].m_ei.m_count + lVar17),iVar18,
                       (ON_Interval *)0x0,0.0);
      iVar18 = iVar18 + 1;
      lVar17 = lVar17 + 0x58;
    } while (lVar17 != 0x118);
    lVar17 = 0x1c;
    do {
      pOVar8 = (this_01->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      local_b8 = (this_01->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_a;
      iVar18 = *(int *)(&UNK_006b7710 + lVar17);
      local_90 = local_b8 + iVar18;
      iVar5 = *(int *)(&UNK_006b7714 + lVar17);
      iVar6 = *(int *)(&UNK_006b7718 + lVar17);
      iVar7 = *(int *)(&UNK_006b771c + lVar17);
      pOVar16 = (ON_BrepVertex *)0x0;
      if ((long)iVar18 < 0) {
        local_90 = (ON_BrepEdge *)0x0;
      }
      else {
        pOVar16 = pOVar8 + local_90->m_vi[*(int *)((long)&DAT_006b7720 + lVar17) != 0];
      }
      local_a0 = local_b8 + *(int *)(&UNK_006b7704 + lVar17);
      local_b0 = local_b8 + *(int *)(&UNK_006b7708 + lVar17);
      local_b8 = local_b8 + *(int *)(&UNK_006b770c + lVar17);
      p = &pOVar8[local_a0->m_vi[iVar5 != 0]].super_ON_Point.point;
      this_03 = &pOVar8[local_b0->m_vi[iVar6 != 0]].super_ON_Point.point;
      local_a8 = lVar17;
      if (iVar18 < 0) {
        this_02 = &pOVar8[local_b8->m_vi[iVar7 != 0]].super_ON_Point.point;
        ON_3dPoint::operator-(&local_78,this_02,p);
        ON_3dPoint::operator+(&local_d0,this_03,&local_78);
        pS = ON_NurbsSurfaceQuadrilateral(p,this_03,&local_d0,this_02,(ON_NurbsSurface *)0x0);
      }
      else {
        pS = ON_NurbsSurfaceQuadrilateral
                       (p,this_03,&pOVar8[local_b8->m_vi[iVar7 != 0]].super_ON_Point.point,
                        &(pOVar16->super_ON_Point).point,(ON_NurbsSurface *)0x0);
      }
      si = ON_Brep::AddSurface(this_01,&pS->super_ON_Surface);
      pOVar9 = (this_01->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si];
      (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar9,0);
      local_d0.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_d0.y = in_XMM1_Qa;
      (*((this_01->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[si]->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x26])();
      local_78.y = in_XMM1_Qa;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_d0,0);
      dVar4 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_78,0);
      ON_2dPoint::Set(&local_88,dVar4,*pdVar14);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_d0,1);
      dVar4 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_78,0);
      ON_2dPoint::Set(&local_40,dVar4,*pdVar14);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_d0,1);
      dVar4 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_78,1);
      ON_2dPoint::Set(&local_50,dVar4,*pdVar14);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_d0,0);
      dVar4 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&local_78,1);
      in_XMM1_Qa = *pdVar14;
      ON_2dPoint::Set(&local_60,dVar4,in_XMM1_Qa);
      face = ON_Brep::NewFace(this_01,si);
      loop = ON_Brep::NewLoop(this_01,outer,face);
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      if (iVar18 < 0) {
        ON_LineCurve::ON_LineCurve(pOVar11,&local_88,&local_40);
        iVar18 = ON_Brep::AddTrimCurve(this_01,(ON_Curve *)pOVar11);
        pOVar15 = ON_Brep::NewTrim(this_01,local_a0,iVar5 != 0,loop,iVar18);
        pOVar15->m_iso = S_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&local_40,&local_60);
        iVar18 = ON_Brep::AddTrimCurve(this_01,(ON_Curve *)pOVar11);
        pOVar15 = ON_Brep::NewTrim(this_01,local_b0,iVar6 != 0,loop,iVar18);
        pOVar15->m_iso = not_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&local_60,&local_88);
        lVar17 = local_a8;
        iVar18 = ON_Brep::AddTrimCurve(this_01,(ON_Curve *)pOVar11);
        pOVar15 = ON_Brep::NewTrim(this_01,local_b8,iVar7 != 0,loop,iVar18);
      }
      else {
        ON_LineCurve::ON_LineCurve(pOVar11,&local_88,&local_40);
        iVar18 = ON_Brep::AddTrimCurve(this_01,(ON_Curve *)pOVar11);
        pOVar15 = ON_Brep::NewTrim(this_01,local_a0,iVar5 != 0,loop,iVar18);
        pOVar15->m_iso = S_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&local_40,&local_50);
        iVar18 = ON_Brep::AddTrimCurve(this_01,(ON_Curve *)pOVar11);
        pOVar15 = ON_Brep::NewTrim(this_01,local_b0,iVar6 != 0,loop,iVar18);
        pOVar15->m_iso = E_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&local_50,&local_60);
        lVar17 = local_a8;
        iVar18 = ON_Brep::AddTrimCurve(this_01,(ON_Curve *)pOVar11);
        pOVar15 = ON_Brep::NewTrim(this_01,local_b8,iVar7 != 0,loop,iVar18);
        pOVar15->m_iso = N_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&local_60,&local_88);
        iVar18 = ON_Brep::AddTrimCurve(this_01,(ON_Curve *)pOVar11);
        pOVar15 = ON_Brep::NewTrim(this_01,local_90,*(int *)((long)&DAT_006b7720 + lVar17) != 0,loop
                                   ,iVar18);
      }
      this_00 = local_98;
      pOVar15->m_iso = W_iso;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0xbc);
    lVar17 = (long)(this_01->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>
                   .m_count;
    if (0 < lVar17) {
      pOVar15 = (this_01->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                m_a;
      lVar19 = 0;
      do {
        iVar18 = (*(int *)((long)pOVar15->m_vi + lVar19 + -4) >> 0x1f) * -2 + 2;
        if (*(int *)((long)pOVar15->m_vi + lVar19) == *(int *)((long)pOVar15->m_vi + lVar19 + 4)) {
          iVar18 = 4;
        }
        *(int *)((long)pOVar15->m_vi + lVar19 + 0xc) = iVar18;
        puVar3 = (undefined8 *)((long)pOVar15->m_tolerance + lVar19);
        *puVar3 = 0;
        puVar3[1] = 0;
        lVar19 = lVar19 + 0xe8;
      } while (lVar17 * 0xe8 - lVar19 != 0);
    }
    iVar18 = (*(this_01->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this_01,0);
    if ((char)iVar18 != '\0') {
      return this_01;
    }
    if (this_00 == (ON_Brep *)0x0) {
      (*(this_01->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_01);
    }
    else {
      ON_Brep::Destroy(this_00);
    }
  }
  return (ON_Brep *)0x0;
}

Assistant:

ON_Brep* ON_BrepWedge( const ON_3dPoint* corners, ON_Brep* pBrep )
{
  ON_Brep* brep = 0;

  int vi, ei, ti, fi, si, c2i;
  
  if(corners)
  {
    // use the one passed in or make a new one
    if( pBrep ) 
    {
      pBrep->Destroy();
      brep = pBrep;
    }
    else
      brep = new ON_Brep();
    
    brep->m_C2.Reserve(18);
    brep->m_C3.Reserve(9);
    brep->m_S.Reserve(5);
    brep->m_V.Reserve(6);
    brep->m_E.Reserve(9);
    brep->m_L.Reserve(5);
    brep->m_T.Reserve(18);
    brep->m_F.Reserve(5);

    // vertices
    for ( vi = 0; vi < 6; vi++ )
    {
      brep->NewVertex( corners[vi], 0.0 );
    }
    
    // 3d edges around bottom e0 - e2
    for ( ei = 0; ei < 3; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[(ei+1)%3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d edges around top e3 - e5
    for ( ei = 3; ei < 6; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[ei==5?3:(ei+1)];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d vertical edges e6 - e8
    for ( ei = 6; ei < 9; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei-6];
      ON_BrepVertex& v1 = brep->m_V[ei-3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }

    /*
    //
    //                      /v5    
    //                     /|\       
    //                    / | \     
    //                   e5 |  e4   
    //                  /   e8  \     
    //                 /__e3_____\  
    //               v3|    |    |v4     
    //                 |    |    |       
    //                 |    /v2  |   
    //                 e6  / \   e7   
    //                 |  /   \  |   
    //                 | e2    e1|   
    //                 |/       \|     
    //                 /____e0___\  
    //               v0           v1
    */

    struct {
      int e[4], bRev[4];
    } f[5] = {
      {{0, 7, 3, 6},  {false, false, true,  true}},  // vertical front
      {{1, 8, 4, 7},  {false, false, true,  true}},  // vertical right
      {{2, 6, 5, 8},  {false, false, true,  true}},  // vertical left
      {{2, 1, 0,-1},  {true,  true,  true,  true}},  // bottom
      {{3, 4, 5,-1},  {false, false, false, false}}  // top
    };
    for ( fi = 0; fi < 5; fi++ )
    {
      ON_BrepEdge* e0;
      ON_BrepEdge* e1;
      ON_BrepEdge* e2;
      ON_BrepEdge* e3=0;

      e0 = &brep->m_E[f[fi].e[0]];
      e1 = &brep->m_E[f[fi].e[1]];
      e2 = &brep->m_E[f[fi].e[2]];
      if( f[fi].e[3] >= 0)
        e3 = &brep->m_E[f[fi].e[3]];

      ON_BrepVertex* v0;
      ON_BrepVertex* v1;
      ON_BrepVertex* v2;
      ON_BrepVertex* v3=0;

      v0 = &brep->m_V[e0->m_vi[f[fi].bRev[0]?1:0]];
      v1 = &brep->m_V[e1->m_vi[f[fi].bRev[1]?1:0]];
      v2 = &brep->m_V[e2->m_vi[f[fi].bRev[2]?1:0]];
      if( f[fi].e[3] >= 0)
        v3 = &brep->m_V[e3->m_vi[f[fi].bRev[3]?1:0]];

      ON_NurbsSurface* srf;

      if( f[fi].e[3] >= 0)
        // 4 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v2->point, v3->point);
      else
        // 3 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v1->point + (v2->point - v0->point), v2->point);

      si = brep->AddSurface( srf);

      ON_Interval s = brep->m_S[si]->Domain(0);
      ON_Interval t = brep->m_S[si]->Domain(1);
      ON_2dPoint p0, p1, p2, p3;
      p0.Set(s[0],t[0]);
      p1.Set(s[1],t[0]);
      p2.Set(s[1],t[1]);
      p3.Set(s[0],t[1]);

      ON_BrepFace& face = brep->NewFace( si );
      ON_BrepLoop& loop = brep->NewLoop( ON_BrepLoop::outer, face );

      if( f[fi].e[3] >= 0)
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // east side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p2 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::E_iso;
        
        // north side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p2, p3 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::N_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e3, f[fi].bRev[3], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
      else
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // diagonal from upper left to lower right
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p3 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::not_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
    }

    // set trim m_type and m_tolerance[]
    for ( ti = 0; ti < brep->m_T.Count(); ti++ )
    {
      ON_BrepTrim& trim = brep->m_T[ti];
      trim.m_type =  ( trim.m_vi[0] != trim.m_vi[1] && trim.m_ei >= 0 )
                  ? ON_BrepTrim::mated
                  : ON_BrepTrim::singular;
      trim.m_tolerance[0] = 0.0;
      trim.m_tolerance[1] = 0.0;
    }

    if ( !brep->IsValid() ) {
      if ( pBrep )
        pBrep->Destroy();
      else
        delete brep;
      brep = 0;
    }
  }
  else 
    brep = 0;
  return brep;
}